

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

void __thiscall
FIX::DataDictionary::addXMLGroup
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool groupRequired)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pDVar5;
  ConfigError *this_00;
  pointer pDVar6;
  bool local_69b;
  byte local_682;
  byte local_64a;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_5e8;
  allocator<char> local_5d9;
  string local_5d8 [38];
  bool local_5b2;
  allocator<char> local_5b1;
  string local_5b0 [6];
  bool isRequired;
  undefined1 local_590 [8];
  string required_1;
  DOMAttributesPtr attrs_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  allocator<char> local_521;
  string local_520 [32];
  undefined1 local_500 [8];
  string required;
  DOMAttributesPtr attrs_1;
  unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_> local_4b8;
  DOMNodePtr node;
  DataDictionary groupDD;
  int field;
  int delim;
  int group;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  string name;
  DOMAttributesPtr attrs;
  bool groupRequired_local;
  DataDictionary *DD_local;
  string *msgtype_local;
  DOMNode *pNode_local;
  DOMDocument *pDoc_local;
  DataDictionary *this_local;
  
  (*pNode->_vptr_DOMNode[4])();
  std::__cxx11::string::string((string *)local_60);
  pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::operator->
                     ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                      ((long)&name.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"name",&local_81);
  iVar3 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_80,local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
    delim._2_1_ = 1;
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&group,"No name given to group",(allocator<char> *)((long)&delim + 3));
    ConfigError::ConfigError(this_00,(string *)&group);
    delim._2_1_ = 0;
    __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  iVar3 = lookupXMLFieldNumber(this,pDoc,(string *)local_60);
  groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  DataDictionary((DataDictionary *)&node);
  (*pNode->_vptr_DOMNode[2])(&local_4b8);
  do {
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_4b8);
    if (pDVar6 == (pointer)0x0) {
      if (groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0
         ) {
        addGroup(DD,msgtype,iVar3,
                 groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count.
                 _4_4_,(DataDictionary *)&node);
      }
      std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_4b8);
      ~DataDictionary((DataDictionary *)&node);
      std::__cxx11::string::~string((string *)local_60);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&name.field_2 + 8));
      return;
    }
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_4b8);
    (*pDVar6->_vptr_DOMNode[5])(&attrs_1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attrs_1,"field");
    std::__cxx11::string::~string((string *)&attrs_1);
    if (bVar2) {
      pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_4b8);
      groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           lookupXMLFieldNumber(this,pDoc,pDVar6);
      addField((DataDictionary *)&node,
               (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_4b8);
      (*pDVar6->_vptr_DOMNode[4])((undefined1 *)((long)&required.field_2 + 8));
      std::__cxx11::string::string((string *)local_500);
      pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
               operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                           *)((long)&required.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_520,"required",&local_521);
      uVar4 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_520,local_500);
      local_64a = 0;
      bVar1 = local_64a;
      if (((uVar4 & 1) != 0) &&
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_500,"Y"), bVar1 = groupRequired, !bVar2)) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_500,"y");
        local_64a = 0;
        bVar1 = groupRequired;
        if (!bVar2) {
          bVar1 = local_64a;
        }
      }
      local_64a = bVar1;
      std::__cxx11::string::~string(local_520);
      std::allocator<char>::~allocator(&local_521);
      if ((local_64a & 1) != 0) {
        addRequiredField((DataDictionary *)&node,msgtype,
                         (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count);
      }
      std::__cxx11::string::~string((string *)local_500);
      std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                 ((long)&required.field_2 + 8));
    }
    else {
      pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                         (&local_4b8);
      (*pDVar6->_vptr_DOMNode[5])(&local_548);
      bVar2 = std::operator==(&local_548,"component");
      std::__cxx11::string::~string((string *)&local_548);
      if (bVar2) {
        pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get(&local_4b8);
        groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             addXMLComponentFields(this,pDoc,pDVar6,msgtype,(DataDictionary *)&node,false);
      }
      else {
        pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                           (&local_4b8);
        (*pDVar6->_vptr_DOMNode[5])(&attrs_2);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attrs_2,"group");
        std::__cxx11::string::~string((string *)&attrs_2);
        if (bVar2) {
          pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                             (&local_4b8);
          groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               lookupXMLFieldNumber(this,pDoc,pDVar6);
          addField((DataDictionary *)&node,
                   (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
          pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                             (&local_4b8);
          (*pDVar6->_vptr_DOMNode[4])((undefined1 *)((long)&required_1.field_2 + 8));
          std::__cxx11::string::string((string *)local_590);
          pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                   operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                               *)((long)&required_1.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_5b0,"required",&local_5b1);
          uVar4 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_5b0,local_590);
          local_682 = 0;
          if ((uVar4 & 1) != 0) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_590,"Y");
            if (!bVar2) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_590,"y");
              local_682 = 0;
              if (!bVar2) goto LAB_001f99cc;
            }
            local_682 = groupRequired;
          }
LAB_001f99cc:
          std::__cxx11::string::~string(local_5b0);
          std::allocator<char>::~allocator(&local_5b1);
          if ((local_682 & 1) != 0) {
            addRequiredField((DataDictionary *)&node,msgtype,
                             (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
          }
          local_5b2 = false;
          pDVar5 = std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::
                   operator->((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>
                               *)((long)&required_1.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_5d8,"required",&local_5d9);
          uVar4 = (*pDVar5->_vptr_DOMAttributes[2])(pDVar5,local_5d8,local_590);
          std::__cxx11::string::~string(local_5d8);
          std::allocator<char>::~allocator(&local_5d9);
          if ((uVar4 & 1) != 0) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_590,"Y");
            local_69b = true;
            if (!bVar2) {
              local_69b = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_590,"y");
            }
            local_5b2 = local_69b;
          }
          pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::get
                             (&local_4b8);
          addXMLGroup(this,pDoc,pDVar6,msgtype,(DataDictionary *)&node,(bool)(local_5b2 & 1));
          std::__cxx11::string::~string((string *)local_590);
          std::unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_>::~unique_ptr
                    ((unique_ptr<FIX::DOMAttributes,_std::default_delete<FIX::DOMAttributes>_> *)
                     ((long)&required_1.field_2 + 8));
        }
      }
    }
    if (groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0)
    {
      groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           (int)groupDD.m_messageOrderedFields._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::operator->
                       (&local_4b8);
    (*pDVar6->_vptr_DOMNode[3])(&local_5e8);
    pDVar6 = std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::release(&local_5e8);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::reset(&local_4b8,pDVar6);
    std::unique_ptr<FIX::DOMNode,_std::default_delete<FIX::DOMNode>_>::~unique_ptr(&local_5e8);
  } while( true );
}

Assistant:

void DataDictionary::addXMLGroup( DOMDocument* pDoc, DOMNode* pNode,
                                  const std::string& msgtype,
                                  DataDictionary& DD, bool groupRequired  )
{
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if(!attrs->get("name", name))
    throw ConfigError("No name given to group");
  int group = lookupXMLFieldNumber( pDoc, name );
  int delim = 0;
  int field = 0;
  DataDictionary groupDD;
  DOMNodePtr node = pNode->getFirstChildNode();
  while(node.get())
  {
    if( node->getName() == "field" )
    {
      field = lookupXMLFieldNumber( pDoc, node.get() );
      groupDD.addField( field );

      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if( attrs->get("required", required)
         && ( required == "Y" || required =="y" )
         && groupRequired )
      {
        groupDD.addRequiredField(msgtype, field);
      }
    }
    else if( node->getName() == "component" )
    {
      field = addXMLComponentFields( pDoc, node.get(), msgtype, groupDD, false );
    }
    else if( node->getName() == "group" )
    {
      field = lookupXMLFieldNumber( pDoc, node.get() );
      groupDD.addField( field );
      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if( attrs->get("required", required )
         && ( required == "Y" || required =="y" )
         && groupRequired)
      {
        groupDD.addRequiredField(msgtype, field);
      }
      bool isRequired = false;
      if( attrs->get("required", required) )
      isRequired = (required == "Y" || required == "y");
      addXMLGroup( pDoc, node.get(), msgtype, groupDD, isRequired );
    }
    if( delim == 0 ) delim = field;
    RESET_AUTO_PTR(node, node->getNextSiblingNode());
  }

  if( delim ) DD.addGroup( msgtype, group, delim, groupDD );
}